

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalUnion,duckdb::vector<duckdb::LogicalType,true>&,std::reference_wrapper<duckdb::PhysicalOperator>&,std::reference_wrapper<duckdb::PhysicalOperator>&,unsigned_long&,bool&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,
          reference_wrapper<duckdb::PhysicalOperator> *args_1,
          reference_wrapper<duckdb::PhysicalOperator> *args_2,unsigned_long *args_3,bool *args_4)

{
  PhysicalUnion *this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  this_00 = (PhysicalUnion *)ArenaAllocator::AllocateAligned(&this->arena,0x88);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  PhysicalUnion::PhysicalUnion
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_50,args_1->_M_data,args_2->_M_data,
             *args_3,*args_4);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  local_38._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_38);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}